

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::CompositeVisitor::CompositeVisitor(CompositeVisitor *this)

{
  undefined8 *in_RDI;
  
  BaseVisitor::BaseVisitor((BaseVisitor *)0x1285b8);
  *in_RDI = &PTR__CompositeVisitor_00486118;
  std::__cxx11::
  list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
  ::list((list<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
          *)0x1285d8);
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"CompositeVisitor");
  return;
}

Assistant:

CompositeVisitor() : BaseVisitor() { visitorName = "CompositeVisitor"; }